

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O1

int gpioWaveChain(char *buf,uint bufSize)

{
  ulong uVar1;
  ushort uVar2;
  dmaOPage_t *pdVar3;
  dmaOPage_t **ppdVar4;
  uint32_t *dmaAddr;
  dmaOPage_t **ppdVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  undefined4 *puVar15;
  ulong uVar16;
  uint32_t uVar17;
  ulong uVar18;
  uint uVar19;
  
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    gpioWaveChain_cold_1();
  }
  if (libInitialised == '\0') {
    iVar13 = -0x1f;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      gpioWaveChain_cold_2();
    }
  }
  else {
    if (waveClockInited == '\0') {
      stopHardwarePWM();
      initClock(0);
      waveClockInited = '\x01';
      PWMClockInited = 0;
    }
    dmaAddr = dmaOut;
    *dmaOut = 0x80000000;
    dmaAddr[1] = 0;
    ppdVar4 = dmaOVirt;
    waveEndPtr = (uint32_t *)0x0;
    pdVar3 = *dmaOVirt;
    uVar17 = 0x4020048;
    if (gpioCfg.clockPeriph == 1) {
      uVar17 = 0x4050048;
    }
    iVar13 = 0x203004;
    if (gpioCfg.clockPeriph == 1) {
      iVar13 = 0x20c018;
    }
    pdVar3->cb[0x1a].info = uVar17;
    pdVar3->cb[0x1a].dst = iVar13 + pi_peri_phys & 0xffffff | 0x7e000000;
    ppdVar5 = dmaOBus;
    iVar13 = (int)*dmaOBus;
    uVar17 = iVar13 + 0xffc;
    pdVar3->cb[0x1a].src = uVar17;
    pdVar3->cb[0x1a].length = 0x50;
    pdVar3->cb[0x1a].next = iVar13 + 0x360;
    iVar6 = waveOutCount;
    if (bufSize == 0) {
      uVar8 = 1;
    }
    else {
      uVar9 = 2;
      uVar16 = 1;
      iVar12 = 0xac4;
      uVar18 = 0;
      do {
        iVar7 = (int)buf[uVar18];
        if ((iVar6 <= iVar7) || (waveInfo[iVar7].deleted != 0)) {
          if ((gpioCfg.internals >> 10 & 1) != 0) {
            return -0x42;
          }
          gpioWaveChain_cold_3();
          return -0x42;
        }
        uVar1 = uVar18 + 1;
        uVar14 = 0xffffffff;
        uVar8 = (uint)uVar1;
        iVar10 = (int)(uVar16 / 0x3c);
        if (uVar8 < 600) {
          uVar14 = iVar10 * 0x3a + 0x1b + (int)uVar18;
        }
        if ((int)uVar14 < 0) {
          if ((gpioCfg.internals >> 10 & 1) != 0) {
            return -0x77;
          }
          gpioWaveChain_cold_5();
          return -0x77;
        }
        uVar19 = 0xffffffff;
        if (uVar8 < 599) {
          uVar19 = (int)(uVar9 / 0x3c) * 0x3a + 0x1c + (int)uVar18;
        }
        if ((int)uVar19 < 0) {
          if ((gpioCfg.internals >> 10 & 1) != 0) {
            return -0x77;
          }
          gpioWaveChain_cold_4();
          return -0x77;
        }
        puVar15 = (undefined4 *)
                  ((long)ppdVar4[(ulong)uVar14 / 0x76]->cb[0].pad +
                  ((ulong)((uVar14 % 0x76) * 0x20) - 0x18));
        if (uVar8 < 600) {
          uVar11 = (ulong)((uint)((uVar1 & 0xffffffff) * 0x88888889 >> 0x22) & 0xfffffff8);
          *(uint *)((uVar16 / 0x3c) * -0xf0 + 0xac4 + *(long *)((long)ppdVar4 + uVar11) + uVar18 * 4
                   ) = (uVar19 % 0x76) * 0x20 + *(int *)(ppdVar5 + (ulong)uVar19 / 0x76);
          *puVar15 = 0x4000008;
          iVar10 = iVar12 + iVar10 * -0xf0 + *(int *)((long)ppdVar5 + uVar11);
        }
        else {
          *puVar15 = 0x4000008;
          iVar10 = 0;
        }
        puVar15[1] = iVar10;
        uVar2 = waveInfo[iVar7].topCB;
        puVar15[2] = ((uint)uVar2 + (uVar2 / 0x76) * -0x76) * 0x20 +
                     *(int *)(ppdVar5 + (ulong)uVar2 / 0x76) + 0x14;
        puVar15[3] = 4;
        uVar14 = waveInfo[iVar7].botCB + 1;
        puVar15[5] = ((uint)waveInfo[iVar7].botCB + (uVar14 / 0x76) * -0x76 + 1) * 0x20 +
                     *(int *)(ppdVar5 + (ulong)uVar14 / 0x76);
        uVar9 = uVar9 + 1;
        uVar16 = uVar16 + 1;
        iVar12 = iVar12 + 4;
        uVar18 = uVar1;
      } while (bufSize != uVar1);
      uVar8 = uVar8 + 1;
    }
    uVar14 = 0xffffffff;
    if (uVar8 < 600) {
      uVar14 = uVar8 + (uVar8 / 0x3c) * 0x3a + 0x1a;
    }
    if ((int)uVar14 < 0) {
      iVar13 = -0x77;
      if ((gpioCfg.internals >> 10 & 1) == 0) {
        gpioWaveChain_cold_6();
      }
    }
    else {
      puVar15 = (undefined4 *)
                ((long)ppdVar4[(ulong)uVar14 / 0x76]->cb[0].pad +
                ((ulong)((uVar14 % 0x76) * 0x20) - 0x18));
      *puVar15 = 0x4000008;
      puVar15[1] = uVar17;
      puVar15[2] = uVar17;
      puVar15[3] = 4;
      puVar15[5] = 0;
      initDMAgo(dmaAddr,iVar13 + 0x340);
      iVar13 = 0;
      waveEndPtr = puVar15 + 5;
    }
  }
  return iVar13;
}

Assistant:

int gpioWaveChain(char *buf, unsigned bufSize)
{
   unsigned blklen=16, blocks=4;
   int cb, chaincb;
   rawCbs_t *p;
   int i, wid, cmd, loop, counters;
   unsigned cycles, delayCBs, dcb, delayLeft;
   uint32_t repeat, next, *endPtr;
   int stk_pos[10], stk_lev=0;

   cb = 0;
   loop = -1;

   DBG(DBG_USER, "bufSize=%d [%s]", bufSize, myBuf2Str(bufSize, buf));

   CHECK_INITED;

   if (!waveClockInited)
   {
      stopHardwarePWM();
      initClock(0); /* initialise secondary clock */
      waveClockInited = 1;
      PWMClockInited = 0;
   }

   dmaOut[DMA_CS] = DMA_CHANNEL_RESET;
   dmaOut[DMA_CONBLK_AD] = 0;
   waveEndPtr = NULL;
   endPtr = NULL;

   /* add delay cb at start of DMA */

   p = rawWaveCBAdr(chainGetCB(cb++));

   /* use the secondary clock */

   if (gpioCfg.clockPeriph != PI_CLOCK_PCM)
   {
      p->info = NORMAL_DMA | TIMED_DMA(2);
      p->dst  = PCM_TIMER;
   }
   else
   {
      p->info = NORMAL_DMA | TIMED_DMA(5);
      p->dst  = PWM_TIMER;
   }

   p->src    = (uint32_t) (&dmaOBus[0]->periphData);
   p->length = BPD * 20 / PI_WF_MICROS; /* 20 micros delay */
   p->next   = waveCbPOadr(chainGetCB(cb));

   counters = 0;
   wid = -1;

   i = 0;

   while (i<bufSize)
   {
      wid = (unsigned)buf[i];

      if (wid == 255) /* wave command */
      {
         if ((i+2) > bufSize)
            SOFT_ERROR(PI_BAD_CHAIN_CMD,
               "incomplete chain command (at %d)", i);

         cmd = buf[i+1];

         if (cmd == 0) /* loop begin */
         {
            if (stk_lev >= (sizeof(stk_pos)/sizeof(int)))
               SOFT_ERROR(PI_CHAIN_NESTING,
                  "chain counters nested too deep (at %d)", i);

            stk_pos[stk_lev++] = cb;

            i += 2;
         }
         else if (cmd == 1) /* loop end */
         {
            if (counters >= WCB_COUNTERS)
               SOFT_ERROR(PI_CHAIN_COUNTER,
                  "too many chain counters (at %d)", i);

            if ((i+4) > bufSize)
               SOFT_ERROR(PI_BAD_CHAIN_CMD,
                  "incomplete chain command (at %d)", i);

            loop = 0;
            if (--stk_lev >= 0) loop = stk_pos[stk_lev];

            if ((loop < 1) || (loop == cb))
               SOFT_ERROR(PI_BAD_CHAIN_LOOP,
                  "empty chain loop (at %d)", i);

            cycles = ((unsigned)buf[i+3] <<  8) + (unsigned)buf[i+2];

            i += 4;

            if (cycles > PI_MAX_WAVE_CYCLES)
               SOFT_ERROR(PI_CHAIN_LOOP_CNT,
                  "bad chain loop count (%d)", cycles);

            if (cycles == 0)
            {
               /* Skip the complete loop block.  Change
                  the next pointing to the start of the
                  loop block to the current cb.
               */
               p = rawWaveCBAdr(chainGetCB(loop));
               p->next = waveCbPOadr(chainGetCB(cb));
            }
            else if (cycles == 1)
            {
               /* Nothing to do, no need for a counter. */
            }
            else
            {
               chaincb = chainGetCB(cb++);
               if (chaincb < 0)
                  SOFT_ERROR(PI_CHAIN_TOO_BIG, "chain is too long (%d)", cb);

               p = rawWaveCBAdr(chaincb);

               repeat = waveCbPOadr(chainGetCB(loop));

                /* Need to check next cb as well. */

               chaincb = chainGetCB(cb);

               if (chaincb < 0)
                  SOFT_ERROR(PI_CHAIN_TOO_BIG, "chain is too long (%d)", cb);

               next = waveCbPOadr(chainGetCB(cb));

               /* dummy src and dest */
               p->info = NORMAL_DMA;
               p->src = (uint32_t) (&dmaOBus[0]->periphData);
               p->dst = (uint32_t) (&dmaOBus[0]->periphData);
               p->length = 4;
               p->next = waveCbPOadr(chainGetCntCB(counters));

               chainMakeCounter(counters, blklen, blocks,
                            cycles-1, repeat, next);

               counters++;
            }
         }
         else if (cmd == 2) /* delay us */
         {
            if ((i+4) > bufSize)
               SOFT_ERROR(PI_BAD_CHAIN_CMD,
                  "incomplete chain command (at %d)", i);

            cycles = ((unsigned)buf[i+3] <<  8) + (unsigned)buf[i+2];

            i += 4;

            if (cycles > PI_MAX_WAVE_DELAY)
               SOFT_ERROR(PI_BAD_CHAIN_DELAY,
                  "bad chain delay micros (%d)", cycles);

            if (cycles)
            {
               delayLeft = cycles;
               delayCBs = waveDelayCBs(delayLeft);
               for (dcb=0; dcb<delayCBs; dcb++)
               {
                  chaincb = chainGetCB(cb++);

                  if (chaincb < 0)
                     SOFT_ERROR(
                        PI_CHAIN_TOO_BIG, "chain is too long (%d)", cb);

                  p = rawWaveCBAdr(chaincb);

                  /* use the secondary clock */

                  if (gpioCfg.clockPeriph != PI_CLOCK_PCM)
                  {
                     p->info = NORMAL_DMA | TIMED_DMA(2);
                     p->dst  = PCM_TIMER;
                  }
                  else
                  {
                     p->info = NORMAL_DMA | TIMED_DMA(5);
                     p->dst  = PWM_TIMER;
                  }

                  p->src = (uint32_t) (&dmaOBus[0]->periphData);

                  p->length = BPD * delayLeft / PI_WF_MICROS;

                  if ((gpioCfg.DMAsecondaryChannel >= DMA_LITE_FIRST) &&
                      (p->length > DMA_LITE_MAX))
                  {
                     p->length = DMA_LITE_MAX;
                  }

                  delayLeft -= (p->length / BPD);

                  p->next = waveCbPOadr(chainGetCB(cb));
               }
            }
         }
         else if (cmd == 3) /* repeat loop forever */
         {
            i += 2;

            loop = 0;
            if (--stk_lev >= 0) loop = stk_pos[stk_lev];

            if ((loop < 1) || (loop == cb))
               SOFT_ERROR(PI_BAD_CHAIN_LOOP,
                  "empty chain loop (at %d)", i);

            chaincb = chainGetCB(cb++);
            if (chaincb < 0)
               SOFT_ERROR(PI_CHAIN_TOO_BIG, "chain is too long (%d)", cb);

            if (i < bufSize)
               SOFT_ERROR(PI_BAD_FOREVER,
                  "loop forever must be last command");

            p = rawWaveCBAdr(chaincb);

            /* dummy src and dest */
            p->info = NORMAL_DMA;
            p->src = (uint32_t) (&dmaOBus[0]->periphData);
            p->dst = (uint32_t) (&dmaOBus[0]->periphData);
            p->length = 4;
            p->next = waveCbPOadr(chainGetCB(loop));
            endPtr = &p->next;
         }
         else
            SOFT_ERROR(PI_BAD_CHAIN_CMD,
               "unknown chain command (255 %d)", cmd);
      }
      else if ((wid >= waveOutCount) || waveInfo[wid].deleted)
         SOFT_ERROR(PI_BAD_WAVE_ID, "undefined wave (%d)", wid);
      else
      {
         chaincb = chainGetCB(cb++);

         if (chaincb < 0)
            SOFT_ERROR(PI_CHAIN_TOO_BIG, "chain is too long (%d)", cb);

         p = rawWaveCBAdr(chaincb);

         chaincb = chainGetCB(cb);

         if (chaincb < 0)
            SOFT_ERROR(PI_CHAIN_TOO_BIG, "chain is too long (%d)", cb);

         chainSetVal(cb-1, waveCbPOadr(chaincb));

         /* patch next of wid topCB to next cb */

         p->info   = NORMAL_DMA;
         p->src    = chainGetValPadr(cb-1); /* this next */
         p->dst    = waveCbPOadr(waveInfo[wid].topCB) + 20; /* wid next */
         p->length = 4;
         p->next   = waveCbPOadr(waveInfo[wid].botCB+1);

         i += 1;
      }
   }

   chaincb = chainGetCB(cb++);

   if (chaincb < 0)
      SOFT_ERROR(PI_CHAIN_TOO_BIG, "chain is too long (%d)", cb);

   p = rawWaveCBAdr(chaincb);

   p->info   = NORMAL_DMA;
   p->src    = (uint32_t) (&dmaOBus[0]->periphData);
   p->dst    = (uint32_t) (&dmaOBus[0]->periphData);
   p->length = 4;
   p->next = 0;

   if (!endPtr) endPtr = &p->next;

   initDMAgo((uint32_t *)dmaOut, waveCbPOadr(chainGetCB(0)));

   waveEndPtr = endPtr;

   return 0;
}